

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O2

int deqp::egl::SurfaceConfig::getCaveatRank(EGLenum caveat)

{
  int iVar1;
  TestError *this;
  allocator<char> local_89;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  code *local_28;
  EGLenum local_20;
  
  if (caveat == 0x3038) {
    iVar1 = 0;
  }
  else if (caveat == 0x3051) {
    iVar1 = 2;
  }
  else {
    if (caveat != 0x3050) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Unknown config caveat: ",&local_89);
      local_28 = eglu::getConfigCaveatName;
      local_20 = caveat;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_28);
      std::operator+(&local_48,&local_68,&local_88);
      tcu::TestError::TestError
                (this,local_48._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,100);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int getCaveatRank (EGLenum caveat)
	{
		switch (caveat)
		{
			case EGL_NONE:					return 0;
			case EGL_SLOW_CONFIG:			return 1;
			case EGL_NON_CONFORMANT_CONFIG:	return 2;
			default:
				TCU_THROW(TestError, (std::string("Unknown config caveat: ") + eglu::getConfigCaveatStr(caveat).toString()).c_str());
		}
	}